

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O2

void __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::RBPath::fixup(RBPath *this,bool expected)

{
  uintptr_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  bool *pbVar4;
  
  if ((int)CONCAT71(in_register_00000031,expected) != 0) {
    uVar2 = this->length;
    pbVar4 = &(this->path)._M_elems[1].dir;
    for (uVar3 = 1; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      puVar1 = (uintptr_t *)
               ((**(ulong **)(pbVar4 + -0x18) & 0xfffffffffffffffe) + (ulong)(*pbVar4 ^ 1) * 8);
      if (puVar1 != (((RBStep *)(pbVar4 + -8))->node).ptr.val) {
        (((RBStep *)(pbVar4 + -8))->node).ptr.val = puVar1;
      }
      pbVar4 = pbVar4 + 0x10;
    }
  }
  return;
}

Assistant:

void fixup(bool expected = true)
      {
        if (!run_checks && !expected)
          return;

        // During a splice in remove the path can be invalidated,
        // this refreshs the path so that the it refers to the spliced
        // nodes fields.
        // TODO optimise usage to avoid traversing whole path.
        for (size_t i = 1; i < length; i++)
        {
          auto parent = path[i - 1].node;
          auto& curr = path[i].node;
          auto dir = path[i].dir;
          auto actual = get_dir(dir, parent);
          if (actual != curr)
          {
            if (!expected)
            {
              snmalloc::error("Performed an unexpected fixup.");
            }
            curr = actual;
          }
        }
      }